

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O0

void same_stl_string_references_are_equal(void)

{
  Constraint_ *pCVar1;
  string bob;
  allocator local_21;
  string local_20 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"bob",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  pCVar1 = (Constraint_ *)cgreen::create_equal_to_string_constraint(local_20,"bob");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x43,"bob",local_20,pCVar1);
  std::__cxx11::string::~string(local_20);
  return;
}

Assistant:

Ensure(same_stl_string_references_are_equal) {
    std::string bob("bob");
    assert_that(bob, is_equal_to_string(bob));
}